

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O0

batch<float,_xsimd::fma3<xsimd::avx2>_> *
xsimd::kernel::acos<xsimd::fma3<xsimd::avx2>,float>
          (batch<float,_xsimd::fma3<xsimd::avx2>_> *self,requires_arch<generic> param_2)

{
  batch<float,_xsimd::fma3<xsimd::avx2>_> *pbVar1;
  undefined1 auVar2 [16];
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> x_larger_05;
  batch_type x;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffd20;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffd28;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffd30;
  undefined1 auVar3 [16];
  undefined1 in_stack_fffffffffffffd40 [32];
  undefined1 auVar4 [24];
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffd60;
  
  auVar4 = in_stack_fffffffffffffd40._8_24_;
  abs<float,xsimd::fma3<xsimd::avx2>>
            ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffd30);
  batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffd60,auVar4._20_4_);
  operator>((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffd30,
            in_stack_fffffffffffffd28);
  batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffd60,auVar4._20_4_);
  batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffd60,auVar4._20_4_);
  fma<float,xsimd::fma3<xsimd::avx2>>
            ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  sqrt<float,xsimd::fma3<xsimd::avx2>>
            ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffd30);
  select<float,xsimd::fma3<xsimd::avx2>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  asin<float,xsimd::fma3<xsimd::avx2>>
            ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffd30);
  xsimd::operator+(auVar4._8_8_,auVar4._0_8_);
  select<float,xsimd::fma3<xsimd::avx2>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  auVar3 = auVar4._0_16_;
  auVar2 = ZEXT816(0);
  batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffd60,auVar4._20_4_);
  xsimd::operator<((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd28);
  constants::pi<xsimd::batch<float,xsimd::fma3<xsimd::avx2>>>();
  xsimd::operator-(auVar3._8_8_,auVar3._0_8_);
  select<float,xsimd::fma3<xsimd::avx2>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  constants::pio2<xsimd::batch<float,xsimd::fma3<xsimd::avx2>>>();
  xsimd::operator-(auVar2._8_8_,auVar2._0_8_);
  pbVar1 = select<float,xsimd::fma3<xsimd::avx2>>
                     (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20)
  ;
  return pbVar1;
}

Assistant:

inline batch<T, A> acos(batch<T, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<T, A>;
            batch_type x = abs(self);
            auto x_larger_05 = x > batch_type(0.5);
            x = select(x_larger_05, sqrt(fma(batch_type(-0.5), x, batch_type(0.5))), self);
            x = asin(x);
            x = select(x_larger_05, x + x, x);
            x = select(self < batch_type(-0.5), constants::pi<batch_type>() - x, x);
            return select(x_larger_05, x, constants::pio2<batch_type>() - x);
        }